

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

void Abc_ObjPatchFanoutFanin(Abc_Obj_t *pObj,int iObjNew)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < (pObj->vFanouts).nSize) {
    piVar2 = (pObj->vFanouts).pArray;
    ppvVar3 = pObj->pNtk->vObjs->pArray;
    lVar5 = 0;
    do {
      pvVar4 = ppvVar3[piVar2[lVar5]];
      uVar1 = *(uint *)((long)pvVar4 + 0x1c);
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          if (*(int *)(*(long *)((long)pvVar4 + 0x20) + uVar6 * 4) == pObj->Id) {
            *(int *)(*(long *)((long)pvVar4 + 0x20) + uVar6 * 4) = iObjNew;
            goto LAB_00841102;
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
        uVar6 = (ulong)uVar1;
      }
LAB_00841102:
      if (*(int *)((long)pvVar4 + 0x1c) <= (int)uVar6) {
        __assert_fail("k < Vec_IntSize(&pFanout->vFanins)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                      ,0xec,"void Abc_ObjPatchFanoutFanin(Abc_Obj_t *, int)");
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pObj->vFanouts).nSize);
  }
  return;
}

Assistant:

void Abc_ObjPatchFanoutFanin( Abc_Obj_t * pObj, int iObjNew )
{
    Abc_Obj_t * pFanout;
    int i, k, Entry;
    // update fanouts of the node to point to this one
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Vec_IntForEachEntry( &pFanout->vFanins, Entry, k )
            if ( Entry == (int)Abc_ObjId(pObj) )
            {
                Vec_IntWriteEntry( &pFanout->vFanins, k, iObjNew );
                break;
            }
        assert( k < Vec_IntSize(&pFanout->vFanins) );
    }
}